

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O1

UINT8 CompressDataBlk(UINT32 outLen,UINT8 *outData,UINT32 inLen,UINT8 *inData,PCM_CMP_INF *cmprInfo)

{
  byte *pbVar1;
  ushort *puVar2;
  byte bVar3;
  byte bVar4;
  UINT8 UVar5;
  byte bVar6;
  UINT16 srcLen;
  PCM_COMPR_TBL *pPVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  byte bVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  short sVar17;
  uint uVar18;
  ulong uVar19;
  ushort uVar20;
  uint uVar21;
  ushort uVar22;
  ushort uVar23;
  uint uVar24;
  long lVar25;
  UINT32 dstLen;
  uint uVar26;
  UINT16 *local_50;
  UINT16 local_38;
  
  if (cmprInfo->comprType != '\0') {
    return 0x80;
  }
  bVar3 = cmprInfo->bitsDec;
  uVar16 = bVar3 + 7 >> 3;
  if (uVar16 == 2) {
    lVar25 = 1L << (bVar3 & 0x3f);
    bVar4 = cmprInfo->bitsCmp;
    uVar11 = (ushort)bVar4;
    uVar12 = cmprInfo->baseVal;
    UVar5 = cmprInfo->subType;
    dstLen = (UINT32)lVar25;
    if (UVar5 == '\x02') {
      pPVar7 = cmprInfo->comprTbl;
      uVar13 = pPVar7->valueCount;
      if (uVar13 == 0) {
        return '\x10';
      }
      if (bVar3 != pPVar7->bitsDec) {
        return '\x11';
      }
      if (bVar4 != pPVar7->bitsCmp) {
        return '\x11';
      }
      local_50 = (UINT16 *)malloc(lVar25 * 2);
      GenerateReverseLUT_16(dstLen,local_50,(uint)uVar13,(pPVar7->values).d16);
    }
    else {
      local_50 = (UINT16 *)0x0;
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = CONCAT71(0,bVar4);
    uVar16 = SUB164((ZEXT416(outLen) << 4) / auVar9,0);
    if (uVar16 < inLen) {
      inLen = uVar16;
    }
    puVar2 = (ushort *)(inData + inLen);
    if (UVar5 == '\0') {
      if (inLen != 0) {
        uVar13 = 0;
        do {
          uVar20 = *(ushort *)inData;
          *outData = *outData & (byte)(-0x100 >> ((byte)uVar13 & 0x1f));
          if (bVar4 != 0) {
            sVar17 = 0;
            uVar22 = uVar11;
            do {
              uVar23 = 8;
              if (uVar22 < 8) {
                uVar23 = uVar22;
              }
              uVar13 = uVar13 + uVar23;
              uVar16 = ((uint)uVar20 - (uint)uVar12 >> ((byte)sVar17 & 0x1f) & 0xffff &
                       ~(-1 << ((byte)uVar23 & 0x1f))) << 8;
              *outData = *outData | (byte)(uVar16 >> ((byte)uVar13 & 0x1f));
              if (7 < uVar13) {
                uVar13 = uVar13 - 8;
                outData[1] = (byte)(uVar16 >> ((byte)uVar13 & 0x1f));
                outData = outData + 1;
              }
              uVar22 = uVar22 - uVar23;
              sVar17 = sVar17 + uVar23;
            } while (uVar22 != 0);
          }
          inData = (UINT8 *)((long)inData + 2);
        } while (inData < puVar2);
      }
    }
    else if (UVar5 == '\x01') {
      if (inLen != 0) {
        uVar13 = 0;
        do {
          uVar20 = *(ushort *)inData;
          *outData = *outData & (byte)(-0x100 >> ((byte)uVar13 & 0x1f));
          if (bVar4 != 0) {
            sVar17 = 0;
            uVar22 = uVar11;
            do {
              uVar23 = 8;
              if (uVar22 < 8) {
                uVar23 = uVar22;
              }
              uVar13 = uVar13 + uVar23;
              uVar16 = (((uint)uVar20 - (uint)uVar12 >> (bVar3 - bVar4 & 0x1f)) >>
                        ((byte)sVar17 & 0x1f) & 0xffff & ~(-1 << ((byte)uVar23 & 0x1f))) << 8;
              *outData = *outData | (byte)(uVar16 >> ((byte)uVar13 & 0x1f));
              if (7 < uVar13) {
                uVar13 = uVar13 - 8;
                outData[1] = (byte)(uVar16 >> ((byte)uVar13 & 0x1f));
                outData = outData + 1;
              }
              uVar22 = uVar22 - uVar23;
              sVar17 = sVar17 + uVar23;
            } while (uVar22 != 0);
          }
          inData = (UINT8 *)((long)inData + 2);
        } while (inData < puVar2);
      }
    }
    else if ((UVar5 == '\x02') && (inLen != 0)) {
      uVar12 = 0;
      do {
        uVar13 = local_50[(uint)*(ushort *)inData & dstLen + 0xffff];
        *outData = *outData & (byte)(-0x100 >> ((byte)uVar12 & 0x1f));
        if (CONCAT71(0,bVar4) != 0) {
          sVar17 = 0;
          uVar20 = uVar11;
          do {
            uVar22 = 8;
            if (uVar20 < 8) {
              uVar22 = uVar20;
            }
            uVar12 = uVar12 + uVar22;
            uVar16 = ((uint)(uVar13 >> ((byte)sVar17 & 0x1f)) & ~(-1 << ((byte)uVar22 & 0x1f))) << 8
            ;
            *outData = *outData | (byte)(uVar16 >> ((byte)uVar12 & 0x1f));
            if (7 < uVar12) {
              uVar12 = uVar12 - 8;
              outData[1] = (byte)(uVar16 >> ((byte)uVar12 & 0x1f));
              outData = outData + 1;
            }
            uVar20 = uVar20 - uVar22;
            sVar17 = sVar17 + uVar22;
          } while (uVar20 != 0);
        }
        inData = (UINT8 *)((long)inData + 2);
      } while (inData < puVar2);
    }
  }
  else {
    if (uVar16 != 1) {
      return ' ';
    }
    uVar19 = 1L << (bVar3 & 0x3f);
    bVar4 = cmprInfo->bitsCmp;
    uVar16 = (uint)bVar4;
    uVar14 = (uint)(byte)cmprInfo->baseVal;
    UVar5 = cmprInfo->subType;
    if (UVar5 == '\x02') {
      pPVar7 = cmprInfo->comprTbl;
      srcLen = pPVar7->valueCount;
      if (srcLen == 0) {
        return '\x10';
      }
      if (bVar3 != pPVar7->bitsDec) {
        return '\x11';
      }
      if (bVar4 != pPVar7->bitsCmp) {
        return '\x11';
      }
      local_50 = (UINT16 *)malloc(uVar19 & 0xffff);
      local_38 = (UINT16)uVar19;
      GenerateReverseLUT_8(local_38,(UINT8 *)local_50,srcLen,(pPVar7->values).d8);
    }
    else {
      local_50 = (UINT16 *)0x0;
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = CONCAT71(0,bVar4);
    uVar26 = SUB164((ZEXT416(outLen) << 3) / auVar8,0);
    if (uVar26 < inLen) {
      inLen = uVar26;
    }
    pbVar1 = inData + inLen;
    if (UVar5 == '\0') {
      if (inLen != 0) {
        iVar15 = 0;
        do {
          bVar3 = *inData;
          *outData = *outData & (byte)(-0x100 >> ((byte)iVar15 & 0x1f));
          if (bVar4 != 0) {
            uVar18 = 0;
            uVar26 = uVar16;
            do {
              uVar24 = 8;
              if ((ushort)uVar26 < 8) {
                uVar24 = uVar26;
              }
              iVar15 = iVar15 + uVar24;
              uVar21 = ((bVar3 - uVar14 & 0xffff) >> ((byte)uVar18 & 0x1f) &
                       ~(-1 << ((byte)uVar24 & 0x1f))) << 8;
              *outData = *outData | (byte)(uVar21 >> ((byte)iVar15 & 0x1f));
              if (7 < (ushort)iVar15) {
                iVar15 = iVar15 + -8;
                outData[1] = (byte)(uVar21 >> ((byte)iVar15 & 0x1f));
                outData = outData + 1;
              }
              uVar26 = uVar26 - uVar24;
              uVar18 = (uVar18 & 0xffff) + (uVar24 & 0xffff);
            } while ((short)uVar26 != 0);
          }
          inData = inData + 1;
        } while (inData < pbVar1);
      }
    }
    else if (UVar5 == '\x01') {
      if (inLen != 0) {
        iVar15 = 0;
        do {
          bVar6 = *inData;
          *outData = *outData & (byte)(-0x100 >> ((byte)iVar15 & 0x1f));
          if (bVar4 != 0) {
            bVar10 = bVar3 - bVar4 & 0x1f;
            uVar18 = 0 >> bVar10;
            uVar26 = uVar16;
            do {
              uVar24 = 8;
              if ((ushort)uVar26 < 8) {
                uVar24 = uVar26;
              }
              iVar15 = iVar15 + uVar24;
              uVar21 = (((int)(bVar6 - uVar14) >> bVar10 & 0xffffU) >> ((byte)uVar18 & 0x1f) &
                       ~(-1 << ((byte)uVar24 & 0x1f))) << 8;
              *outData = *outData | (byte)(uVar21 >> ((byte)iVar15 & 0x1f));
              if (7 < (ushort)iVar15) {
                iVar15 = iVar15 + -8;
                outData[1] = (byte)(uVar21 >> ((byte)iVar15 & 0x1f));
                outData = outData + 1;
              }
              uVar26 = uVar26 - uVar24;
              uVar18 = (uVar18 & 0xffff) + (uVar24 & 0xffff);
            } while ((short)uVar26 != 0);
          }
          inData = inData + 1;
        } while (inData < pbVar1);
      }
    }
    else if ((UVar5 == '\x02') && (inLen != 0)) {
      iVar15 = 0;
      do {
        uVar12 = cmprInfo->comprTbl->valueCount;
        uVar14 = 0;
        if ((ulong)uVar12 != 0) {
          uVar19 = 0;
          do {
            if (*inData == (cmprInfo->comprTbl->values).d8[uVar19]) goto LAB_0010fe10;
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
          uVar19 = (ulong)uVar12;
LAB_0010fe10:
          uVar14 = (uint)uVar19 & 0xffff;
        }
        *outData = *outData & (byte)(-0x100 >> ((byte)iVar15 & 0x1f));
        if (CONCAT71(0,bVar4) != 0) {
          uVar18 = 0;
          uVar26 = uVar16;
          do {
            uVar24 = 8;
            if ((ushort)uVar26 < 8) {
              uVar24 = uVar26;
            }
            iVar15 = iVar15 + uVar24;
            uVar21 = (uVar14 >> ((byte)uVar18 & 0x1f) & ~(-1 << ((byte)uVar24 & 0x1f))) << 8;
            *outData = *outData | (byte)(uVar21 >> ((byte)iVar15 & 0x1f));
            if (7 < (ushort)iVar15) {
              iVar15 = iVar15 + -8;
              outData[1] = (byte)(uVar21 >> ((byte)iVar15 & 0x1f));
              outData = outData + 1;
            }
            uVar26 = uVar26 - uVar24;
            uVar18 = (uVar18 & 0xffff) + (uVar24 & 0xffff);
          } while ((short)uVar26 != 0);
        }
        inData = inData + 1;
      } while (inData < pbVar1);
    }
  }
  if (local_50 != (UINT16 *)0x0) {
    free(local_50);
  }
  return '\0';
}

Assistant:

UINT8 CompressDataBlk(UINT32 outLen, UINT8* outData, UINT32 inLen, const UINT8* inData, const PCM_CMP_INF* cmprInfo)
{
	UINT8 valSize;
	UINT8 retVal;
	
	switch(cmprInfo->comprType)
	{
	case 0x00:	// Bit Packing compression
		valSize = (cmprInfo->bitsDec + 7) / 8;
		if (valSize == 0x01)
			retVal = Compress_BitPacking_8(outLen, outData, inLen, inData, cmprInfo);
		else if (valSize == 0x02)
			retVal = Compress_BitPacking_16(outLen, outData, inLen, inData, cmprInfo);
		else
			retVal = 0x20;	// invalid number of decompressed bits
		if (retVal)
			return retVal;
		break;
	default:
		return 0x80;
	}
	
	return 0x00;
}